

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CFG.cpp
# Opt level: O0

set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> * __thiscall
CFG::successors(CFG *this,CfgNode *node)

{
  bool bVar1;
  pointer ppVar2;
  set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_> *local_40;
  bool local_29;
  _Self local_28;
  _Self local_20;
  const_iterator it;
  CfgNode *node_local;
  CFG *this_local;
  
  local_29 = false;
  it._M_node = (_Base_ptr)node;
  if (node != (CfgNode *)0x0) {
    local_29 = containsNode(this,node);
  }
  if (local_29 == false) {
    __assert_fail("node != 0 && this->containsNode(node)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/rimsa[P]cfgconv/src/CFG.cpp"
                  ,0x81,"const std::set<CfgNode *> &CFG::successors(CfgNode *) const");
  }
  local_20._M_node =
       (_Base_ptr)
       std::
       map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
       ::find(&this->m_succs,(key_type *)&it);
  local_28._M_node =
       (_Base_ptr)
       std::
       map<CfgNode_*,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>,_std::less<CfgNode_*>,_std::allocator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>_>
       ::end(&this->m_succs);
  bVar1 = std::operator!=(&local_20,&local_28);
  if (bVar1) {
    ppVar2 = std::
             _Rb_tree_const_iterator<std::pair<CfgNode_*const,_std::set<CfgNode_*,_std::less<CfgNode_*>,_std::allocator<CfgNode_*>_>_>_>
             ::operator->(&local_20);
    local_40 = &ppVar2->second;
  }
  else {
    local_40 = &emptyset;
  }
  return local_40;
}

Assistant:

const std::set<CfgNode*>& CFG::successors(CfgNode* node) const {
	assert(node != 0 && this->containsNode(node));

	std::map<CfgNode*, std::set<CfgNode*>>::const_iterator it = m_succs.find(node);
	return (it != m_succs.end() ? it->second : emptyset);
}